

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

uint peek_imm_32(m68k_info *info)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  uVar1 = 0xaaaaaaaa;
  if (uVar2 + 4 <= info->code_len) {
    uVar1 = *(uint *)(info->code + uVar2);
    uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  return uVar1;
}

Assistant:

static unsigned int peek_imm_32(const m68k_info *info) { return m68k_read_safe_32((info), (info)->pc); }